

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint64_t uVar5;
  uint8_t **pcode;
  ulong uVar6;
  long lVar7;
  undefined8 in_RCX;
  ulong in_RDX;
  uint8_t *in_RSI;
  HufDec *in_RDI;
  uint64_t in_R8;
  _internal_exr_context *in_R9;
  uint64_t in_stack_00000008;
  uint16_t *in_stack_00000010;
  uint64_t nLeft;
  HufDec *hdec;
  uint64_t *freq;
  FastHufDecoder *fhd;
  uint64_t hufInfoBlockSize;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  uint8_t *ptr;
  uint64_t nBytes;
  uint32_t nBits;
  uint32_t iM;
  uint32_t im;
  int in_stack_0000074c;
  int in_stack_00000750;
  int in_stack_00000754;
  uint8_t **in_stack_00000758;
  FastHufDecoder *in_stack_00000760;
  _internal_exr_context *in_stack_00000768;
  int in_stack_00000780;
  HufDec *in_stack_ffffffffffffff60;
  HufDec *in_stack_ffffffffffffff88;
  uint64_t *hcode;
  uint64_t *hcode_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t rlc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar8;
  
  rlc = (uint32_t)((ulong)in_RCX >> 0x20);
  hcode_00 = (uint64_t *)0x0;
  hcode = (uint64_t *)0x14;
  if (in_RDI != (HufDec *)0x0) {
    hcode_00 = *(uint64_t **)(in_RDI + 1);
  }
  if (in_RDX < 0x14) {
    if (in_R8 == 0) {
      eVar8 = 0;
    }
    else {
      eVar8 = 3;
    }
  }
  else {
    uVar5 = internal_exr_huf_decompress_spare_bytes();
    if (in_stack_00000008 == uVar5) {
      uVar1 = readUInt(in_RSI);
      uVar2 = readUInt(in_RSI + 4);
      uVar3 = readUInt(in_RSI + 0xc);
      if ((uVar1 < 0x10001) && (uVar2 < 0x10001)) {
        pcode = (uint8_t **)(in_RSI + 0x14);
        uVar6 = (ulong)uVar3 + 7 >> 3;
        if (in_RDX < uVar6 + 0x14) {
          eVar8 = 1;
        }
        else {
          iVar4 = fasthuf_decode_enabled();
          if ((iVar4 == 0) || (uVar3 < 0x81)) {
            lVar7 = in_RDX - 0x14;
            hufClearDecTable((HufDec *)0x1247c6);
            hufUnpackEncTable(pcode,(uint64_t *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (uint32_t)((ulong)hcode_00 >> 0x20),(uint32_t)hcode_00,hcode);
            if ((ulong)(lVar7 * 8) < (ulong)uVar3) {
              eVar8 = 0x17;
            }
            else {
              eVar8 = hufBuildDecTable(hcode_00,(uint32_t)((ulong)hcode >> 0x20),(uint32_t)hcode,
                                       in_stack_ffffffffffffff88);
              if (eVar8 == 0) {
                eVar8 = hufDecode((uint64_t *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,in_RSI,in_RDX,rlc,in_R8,in_stack_00000010);
              }
              hufFreeDecTable(in_stack_ffffffffffffff60);
            }
          }
          else {
            eVar8 = fasthuf_initialize(in_stack_00000768,in_stack_00000760,in_stack_00000758,
                                       in_stack_00000754,in_stack_00000750,in_stack_0000074c,
                                       in_stack_00000780);
            if (eVar8 == 0) {
              if (in_RDX < (long)pcode + (uVar6 - (long)in_RSI)) {
                eVar8 = 1;
              }
              else {
                eVar8 = fasthuf_decode(in_R9,(FastHufDecoder *)CONCAT44(uVar1,uVar2),
                                       (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
                                       (int)(uVar6 >> 0x20),(uint16_t *)pcode,0);
              }
            }
          }
        }
      }
      else {
        eVar8 = 0x17;
      }
    }
    else {
      eVar8 = 3;
    }
  }
  return eVar8;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t                            im, iM, nBits;
    uint64_t                            nBytes;
    const uint8_t*                      ptr;
    exr_result_t                        rv;
    const struct _internal_exr_context* pctxt = NULL;
    const uint64_t hufInfoBlockSize           = 5 * sizeof (uint32_t);

    if (decode) pctxt = EXR_CCTXT (decode->context);
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (pctxt, fhd, &ptr, (int) (nCompressed - hufInfoBlockSize), im, iM, iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ( (uint64_t)(ptr - compressed) + nBytes > nCompressed )
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, (int) nRaw);
        }
    }
    else
    {
        uint64_t* freq     = (uint64_t*) spare;
        HufDec*   hdec     = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft    = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (hdec);
    }
    return rv;
}